

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::Reset(ThreadSafeArena *this)

{
  bool bVar1;
  uint64_t uVar2;
  AllocationPolicy *pAVar3;
  ArenaBlock *b;
  size_t offset_00;
  SizedPtr SVar4;
  size_t offset;
  SizedPtr mem;
  CleanupNode *local_30;
  CleanupNode *local_28;
  char *local_20;
  size_t space_allocated;
  ThreadSafeArena *this_local;
  
  uVar2 = SpaceAllocated(this);
  CleanupList(this);
  memset(&mem.n,0,0x20);
  cleanup::ChunkList::ChunkList((ChunkList *)&mem.n);
  (this->first_arena_).cleanup_list_.head_ = (Chunk *)mem.n;
  (this->first_arena_).cleanup_list_.next_ = local_30;
  (this->first_arena_).cleanup_list_.limit_ = local_28;
  (this->first_arena_).cleanup_list_.prefetch_ptr_ = local_20;
  SVar4 = Free(this);
  bVar1 = TaggedAllocationPolicyPtr::is_user_owned_initial_block(&this->alloc_policy_);
  if (!bVar1) {
    pAVar3 = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
    if (pAVar3 == (AllocationPolicy *)0x0) {
      b = anon_unknown_12::SentryArenaBlock();
      SerialArena::Init(&this->first_arena_,b,0);
      goto LAB_00121f6f;
    }
  }
  pAVar3 = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
  offset_00 = 0x30;
  if (pAVar3 == (AllocationPolicy *)0x0) {
    offset_00 = 0x10;
  }
  offset = (size_t)SVar4.p;
  mem.p = (void *)SVar4.n;
  ArenaBlock::ArenaBlock((ArenaBlock *)offset,(ArenaBlock *)0x0,(size_t)mem.p);
  SerialArena::Init(&this->first_arena_,(ArenaBlock *)offset,offset_00);
LAB_00121f6f:
  Init(this);
  return uVar2;
}

Assistant:

uint64_t ThreadSafeArena::Reset() {
  const size_t space_allocated = SpaceAllocated();

  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();
  // Reset the first arena's cleanup list.
  first_arena_.cleanup_list_ = cleanup::ChunkList();

  // Discard all blocks except the first one. Whether it is user-provided or
  // allocated, always reuse the first block for the first arena.
  auto mem = Free();

  // Reset the first arena with the first block. This avoids redundant
  // free / allocation and re-allocating for AllocationPolicy. Adjust offset if
  // we need to preserve alloc_policy_.
  if (alloc_policy_.is_user_owned_initial_block() ||
      alloc_policy_.get() != nullptr) {
    size_t offset = alloc_policy_.get() == nullptr
                        ? kBlockHeaderSize
                        : kBlockHeaderSize + kAllocPolicySize;
    ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(static_cast<char*>(mem.p) + offset,
                                          mem.n - offset);
    first_arena_.Init(new (mem.p) ArenaBlock{nullptr, mem.n}, offset);
  } else {
    first_arena_.Init(SentryArenaBlock(), 0);
  }

  // Since the first block and potential alloc_policy on the first block is
  // preserved, this can be initialized by Init().
  Init();

  return space_allocated;
}